

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

int add_map_item(AMQP_VALUE map,char *name,char *value)

{
  int iVar1;
  AMQP_VALUE key;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE amqp_value_value;
  LOGGER_LOG l;
  AMQP_VALUE amqp_value_name;
  int result;
  char *value_local;
  char *name_local;
  AMQP_VALUE map_local;
  
  key = amqpvalue_create_symbol(name);
  if (key == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"add_map_item",0x1a1,1,"Failed creating AMQP_VALUE for name");
    }
    amqp_value_name._4_4_ = 0x1a2;
  }
  else {
    l_1 = (LOGGER_LOG)0x0;
    if ((value == (char *)0x0) &&
       (l_1 = (LOGGER_LOG)amqpvalue_create_null(), (AMQP_VALUE)l_1 == (AMQP_VALUE)0x0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"add_map_item",0x1aa,1,"Failed creating AMQP_VALUE for NULL value");
      }
      amqp_value_name._4_4_ = 0x1ab;
    }
    else if ((value == (char *)0x0) ||
            (l_1 = (LOGGER_LOG)amqpvalue_create_string(value), (AMQP_VALUE)l_1 != (AMQP_VALUE)0x0))
    {
      iVar1 = amqpvalue_set_map_value(map,key,(AMQP_VALUE)l_1);
      if (iVar1 == 0) {
        amqp_value_name._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"add_map_item",0x1b6,1,"Failed adding key/value pair to map");
        }
        amqp_value_name._4_4_ = 0x1b7;
      }
      amqpvalue_destroy((AMQP_VALUE)l_1);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"add_map_item",0x1af,1,"Failed creating AMQP_VALUE for value");
      }
      amqp_value_name._4_4_ = 0x1b0;
    }
    amqpvalue_destroy(key);
  }
  return amqp_value_name._4_4_;
}

Assistant:

static int add_map_item(AMQP_VALUE map, const char* name, const char* value)
{
    int result;
    AMQP_VALUE amqp_value_name;

    if ((amqp_value_name = amqpvalue_create_symbol(name)) == NULL)
    {
        LogError("Failed creating AMQP_VALUE for name");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE amqp_value_value = NULL;

        if (value == NULL && (amqp_value_value = amqpvalue_create_null()) == NULL)
        {
            LogError("Failed creating AMQP_VALUE for NULL value");
            result = MU_FAILURE;
        }
        else if (value != NULL && (amqp_value_value = amqpvalue_create_string(value)) == NULL)
        {
            LogError("Failed creating AMQP_VALUE for value");
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_map_value(map, amqp_value_name, amqp_value_value) != 0)
            {
                LogError("Failed adding key/value pair to map");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }

            amqpvalue_destroy(amqp_value_value);
        }

        amqpvalue_destroy(amqp_value_name);
    }

    return result;
}